

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O2

void __thiscall bloaty::RollupOutput::AddDataSourceName(RollupOutput *this,string_view name)

{
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = name._M_str;
  local_20._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_41);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void AddDataSourceName(std::string_view name) {
    source_names_.emplace_back(std::string(name));
  }